

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xcard.cpp
# Opt level: O1

string * __thiscall xcard::generateCard_abi_cxx11_(string *__return_storage_ptr__,xcard *this)

{
  char *__nptr;
  ulong uVar1;
  pointer pcVar2;
  char cVar3;
  char cVar4;
  bool bVar5;
  uint uVar6;
  result_type __val;
  int *piVar7;
  long lVar8;
  string *psVar9;
  string *psVar10;
  string *extraout_RAX;
  uint uVar11;
  result_type rVar12;
  int iVar13;
  int iVar14;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar15;
  string __str;
  string cardbuf;
  default_random_engine generator;
  uniform_int_distribution<unsigned_int> dist;
  random_device rd;
  undefined1 *apuStack_1460 [2];
  undefined1 auStack_1450 [16];
  string *psStack_1440;
  char *pcStack_1438;
  int *piStack_1430;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1420;
  xcard *local_1418;
  int local_140c;
  char *local_1408;
  uint local_1400;
  char local_13f8 [16];
  undefined1 *local_13e8;
  long local_13e0;
  undefined1 local_13d8 [16];
  linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> local_13c8;
  param_type local_13c0;
  random_device local_13b8;
  
  local_13e8 = local_13d8;
  local_13e0 = 0;
  local_13d8[0] = 0;
  piStack_1430 = (int *)0x1027cd;
  local_1418 = this;
  std::random_device::random_device(&local_13b8);
  piStack_1430 = (int *)0x1027d7;
  uVar6 = std::random_device::_M_getval();
  uVar11 = uVar6 / 0x7fffffff << 0x1f | uVar6 / 0x7fffffff;
  local_13c8._M_x = (unsigned_long)(uVar11 + uVar6 + (uint)(uVar6 + uVar11 == 0));
  __nptr = (local_1418->prefix)._M_dataplus._M_p;
  piStack_1430 = (int *)0x10280d;
  piVar7 = __errno_location();
  iVar14 = *piVar7;
  *piVar7 = 0;
  piStack_1430 = (int *)0x10282d;
  lVar8 = strtoll(__nptr,&local_1408,10);
  if (local_1408 == __nptr) {
    piStack_1430 = (int *)0x102a03;
    psVar9 = (string *)std::__throw_invalid_argument("stoll");
    piStack_1430 = (int *)0x102a7d;
    __clang_call_terminate();
    apuStack_1460[0] = auStack_1450;
    psStack_1440 = __return_storage_ptr__;
    pcStack_1438 = __nptr;
    piStack_1430 = piVar7;
    std::__cxx11::string::_M_construct<char_const*>((string *)apuStack_1460,"default","");
    psVar10 = (string *)std::random_device::_M_init(psVar9);
    if (apuStack_1460[0] != auStack_1450) {
      operator_delete(apuStack_1460[0]);
      psVar10 = extraout_RAX;
    }
    return psVar10;
  }
  if (*piVar7 != 0) {
    if (*piVar7 != 0x22) goto LAB_00102852;
    piStack_1430 = (int *)0x10284f;
    lVar8 = std::__throw_out_of_range("stoll");
  }
  *piVar7 = iVar14;
LAB_00102852:
  if (-1 < lVar8) {
    piStack_1430 = (int *)0x102871;
    std::__cxx11::string::replace
              ((ulong)&local_13e8,0,(char *)0x0,(ulong)(local_1418->prefix)._M_dataplus._M_p);
  }
  local_13c0._M_a = 0;
  local_13c0._M_b = 9;
  local_140c = (int)local_13e0;
  paVar15 = &__return_storage_ptr__->field_2;
  local_1420 = paVar15;
  iVar14 = 1;
  if (1 < 0x10 - (int)local_13e0) {
    iVar14 = 0x10 - (int)local_13e0;
  }
  do {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar15;
    piStack_1430 = (int *)0x1028c6;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,local_13e8,local_13e8 + local_13e0);
    if (local_140c < 0x10) {
      iVar13 = 0;
      do {
        uVar1 = __return_storage_ptr__->_M_string_length;
        piStack_1430 = (int *)0x1028ea;
        __val = std::uniform_int_distribution<unsigned_int>::operator()
                          ((uniform_int_distribution<unsigned_int> *)&local_13c0,&local_13c8,
                           &local_13c0);
        cVar4 = '\x01';
        if (9 < __val) {
          rVar12 = __val;
          cVar3 = '\x04';
          do {
            cVar4 = cVar3;
            if (rVar12 < 100) {
              cVar4 = cVar4 + -2;
              goto LAB_00102938;
            }
            if (rVar12 < 1000) {
              cVar4 = cVar4 + -1;
              goto LAB_00102938;
            }
            if (rVar12 < 10000) goto LAB_00102938;
            bVar5 = 99999 < rVar12;
            rVar12 = rVar12 / 10000;
            cVar3 = cVar4 + '\x04';
          } while (bVar5);
          cVar4 = cVar4 + '\x01';
        }
LAB_00102938:
        local_1408 = local_13f8;
        piStack_1430 = (int *)0x102950;
        std::__cxx11::string::_M_construct((ulong)&local_1408,cVar4);
        piStack_1430 = (int *)0x102961;
        std::__detail::__to_chars_10_impl<unsigned_int>(local_1408,local_1400,__val);
        piStack_1430 = (int *)0x102978;
        std::__cxx11::string::replace
                  ((ulong)__return_storage_ptr__,uVar1,(char *)0x0,(ulong)local_1408);
        if (local_1408 != local_13f8) {
          piStack_1430 = (int *)0x10298c;
          operator_delete(local_1408);
        }
        iVar13 = iVar13 + 1;
      } while (iVar13 != iVar14);
    }
    piStack_1430 = (int *)0x1029a5;
    bVar5 = LuhnCheck(local_1418,__return_storage_ptr__);
    paVar15 = local_1420;
    if (bVar5) {
      piStack_1430 = (int *)0x1029ce;
      std::random_device::_M_fini();
      if (local_13e8 != local_13d8) {
        piStack_1430 = (int *)0x1029e2;
        operator_delete(local_13e8);
      }
      return __return_storage_ptr__;
    }
    pcVar2 = (__return_storage_ptr__->_M_dataplus)._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar2 != local_1420) {
      piStack_1430 = (int *)0x1029bf;
      operator_delete(pcVar2);
    }
  } while( true );
}

Assistant:

std::string xcard::generateCard()
{

    std::string cardbuf;

    /* Seed */
    std::random_device rd;

    /* Random number generator */
    std::default_random_engine generator(rd());

    if (std::stoll(this->prefix) > -1)
    {
        cardbuf.insert(0, this->prefix);
    }

    std::uniform_int_distribution<unsigned int> dist(0, 9);

    int initial_length = cardbuf.length();
    int genreq = 16 - initial_length;

    while (true)
    {

        std::string cc = cardbuf;
        
        for (int i = 0; i < genreq; i++)
        {
            cc.insert(cc.length(), std::to_string(dist(generator)));
        }

        if (LuhnCheck(cc) == true)
        {
            return cc;
        }
    }
}